

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void build_node(XML_Parser parser,int src_node,XML_Content *dest,XML_Content **contpos,char **strpos
               )

{
  char cVar1;
  XML_Content_Type XVar2;
  uint uVar3;
  int src_node_00;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  
  lVar8 = *(long *)((long)parser + 0x3a8);
  lVar5 = (long)src_node * 0x20;
  XVar2 = *(XML_Content_Type *)(lVar8 + lVar5);
  dest->type = XVar2;
  dest->quant = *(XML_Content_Quant *)(lVar8 + 4 + lVar5);
  if (XVar2 == XML_CTYPE_NAME) {
    dest->name = *strpos;
    pcVar6 = *(char **)(lVar8 + 8 + lVar5);
    do {
      cVar1 = *pcVar6;
      pcVar4 = *strpos;
      *strpos = pcVar4 + 1;
      *pcVar4 = cVar1;
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
    dest->numchildren = 0;
    lVar8 = 0x18;
  }
  else {
    uVar3 = *(uint *)(lVar8 + 0x18 + lVar5);
    dest->numchildren = uVar3;
    dest->children = *contpos;
    *contpos = *contpos + uVar3;
    lVar8 = 8;
    if (dest->numchildren != 0) {
      piVar7 = (int *)(lVar5 + *(long *)((long)parser + 0x3a8) + 0x10);
      lVar8 = 0;
      uVar9 = 0;
      do {
        src_node_00 = *piVar7;
        build_node(parser,src_node_00,(XML_Content *)((long)&dest->children->type + lVar8),contpos,
                   strpos);
        uVar9 = uVar9 + 1;
        piVar7 = (int *)(*(long *)((long)parser + 0x3a8) + (long)src_node_00 * 0x20 + 0x1c);
        lVar8 = lVar8 + 0x20;
      } while (uVar9 < dest->numchildren);
      lVar8 = 8;
    }
  }
  *(undefined8 *)((long)&dest->type + lVar8) = 0;
  return;
}

Assistant:

static void
build_node (XML_Parser parser,
            int src_node,
            XML_Content *dest,
            XML_Content **contpos,
            char **strpos)
{
  dest->type = dtd.scaffold[src_node].type;
  dest->quant = dtd.scaffold[src_node].quant;
  if (dest->type == XML_CTYPE_NAME) {
    const char *src;
    dest->name = *strpos;
    src = dtd.scaffold[src_node].name;
    for (;;) {
      *(*strpos)++ = *src;
      if (! *src)
        break;
      src++;
    }
    dest->numchildren = 0;
    dest->children = 0;
  }
  else {
    unsigned int i;
    int cn;
    dest->numchildren = dtd.scaffold[src_node].childcnt;
    dest->children = *contpos;
    *contpos += dest->numchildren;
    for (i = 0, cn = dtd.scaffold[src_node].firstchild;
         i < dest->numchildren;
         i++, cn = dtd.scaffold[cn].nextsib) {
      build_node(parser, cn, &(dest->children[i]), contpos, strpos);
    }
    dest->name = 0;
  }
}